

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O1

t_int * sigrfft_flip(t_int *w)

{
  t_int tVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  
  tVar1 = w[3];
  if ((int)tVar1 != 0) {
    lVar2 = w[1];
    puVar3 = (uint *)w[2];
    lVar4 = 0;
    do {
      puVar3 = puVar3 + -1;
      *puVar3 = *(uint *)(lVar2 + lVar4 * 4) ^ 0x80000000;
      lVar4 = lVar4 + 1;
    } while ((int)tVar1 != (int)lVar4);
  }
  return w + 4;
}

Assistant:

static t_int *sigrfft_flip(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    while (n--)
        *(--out) = - *in++;
    return (w+4);
}